

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O1

unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> __thiscall
spvtools::opt::InlinePass::InlineBasicBlocks
          (InlinePass *this,
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          *new_blocks,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr,DebugInlinedAtContext *inlined_at_ctx,Function *calleeFn)

{
  bool *pbVar1;
  uint uVar2;
  Instruction *this_00;
  BasicBlock *pBVar3;
  Function *pFVar4;
  IRContext *this_01;
  undefined1 auVar5 [8];
  bool bVar6;
  uint32_t uVar7;
  NonSemanticShaderDebugInfo100Instructions NVar8;
  pointer __p;
  Function *pFVar9;
  long lVar10;
  Instruction *pIVar11;
  ulong uVar12;
  Function *pFVar13;
  long *plVar14;
  InlinePass *pIVar15;
  bool bVar16;
  long in_stack_00000008;
  undefined1 local_50 [8];
  _Any_data local_48;
  Function *local_38;
  
  plVar14 = (long *)(*(long *)(in_stack_00000008 + 0x98) + 8);
  local_48._8_8_ = callee2caller;
  local_38 = calleeFn;
  while (pIVar11 = (Instruction *)0x0, plVar14 != *(long **)(in_stack_00000008 + 0xa0)) {
    std::
    vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>
              ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
                *)local_48._8_8_,
               (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                *)inlined_at_ctx);
    this_00 = *(Instruction **)(*plVar14 + 8);
    uVar7 = 0;
    if (this_00->has_result_id_ == true) {
      uVar7 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
    }
    pBVar3 = new_blk_ptr[1]._M_t.
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    uVar12 = (ulong)uVar7 % (ulong)pBVar3;
    pFVar4 = (&((new_blk_ptr->_M_t).
                super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->function_)
             [uVar12];
    pFVar9 = (Function *)0x0;
    if ((pFVar4 != (Function *)0x0) &&
       (pFVar9 = pFVar4, pFVar13 = *(Function **)&pFVar4->def_inst_,
       uVar7 != *(uint *)&((*(Function **)&pFVar4->def_inst_)->params_).
                          super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
       )) {
      while (pFVar4 = *(Function **)&pFVar13->def_inst_, pFVar4 != (Function *)0x0) {
        uVar2 = *(uint *)&(pFVar4->params_).
                          super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
        ;
        pFVar9 = (Function *)0x0;
        if (((ulong)uVar2 % (ulong)pBVar3 != uVar12) ||
           (pFVar9 = pFVar13, pFVar13 = pFVar4, uVar7 == uVar2)) goto LAB_002239e5;
      }
      pFVar9 = (Function *)0x0;
    }
LAB_002239e5:
    if (pFVar9 == (Function *)0x0) {
      lVar10 = 0;
    }
    else {
      lVar10 = *(long *)&pFVar9->def_inst_;
    }
    pIVar15 = this;
    if (lVar10 == 0) goto LAB_00223b61;
    NewLabel((InlinePass *)local_50,(uint32_t)new_blocks);
    pIVar11 = (Instruction *)operator_new(0x88);
    auVar5 = local_50;
    local_50 = (undefined1  [8])0x0;
    (pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
         (_func_int **)0x0;
    (pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ =
         (Instruction *)auVar5;
    pbVar1 = &(pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_;
    pIVar11->context_ = (IRContext *)0x0;
    pIVar11->opcode_ = OpNop;
    pIVar11->has_type_id_ = false;
    pIVar11->has_result_id_ = false;
    *(undefined2 *)&pIVar11->field_0x2e = 0;
    *(undefined ***)&(pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ =
         &PTR__Instruction_003e9ae0;
    *(undefined4 *)
     &(pIVar11->operands_).
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0;
    (pIVar11->operands_).
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined8 *)
     ((long)&(pIVar11->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start + 6) = 0;
    (pIVar11->dbg_line_insts_).
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar11->dbg_line_insts_).
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar11->dbg_line_insts_).
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pIVar11->dbg_scope_).lexical_scope_ = 0;
    (pIVar11->dbg_scope_).inlined_at_ = 0;
    pIVar11[1].super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
         (_func_int **)0x0;
    pIVar11[1].super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
    pIVar11[1].super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ =
         (Instruction *)0x0;
    pIVar11->context_ = (IRContext *)pbVar1;
    *(bool **)&pIVar11->opcode_ = pbVar1;
    *(undefined1 *)&pIVar11->unique_id_ = 1;
    (pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
         (Instruction *)&PTR__InstructionList_003e9b78;
    local_48._M_unused._M_object = (BasicBlock *)0x0;
    pBVar3 = (BasicBlock *)inlined_at_ctx->call_inst_line_;
    inlined_at_ctx->call_inst_line_ = pIVar11;
    if (pBVar3 != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)inlined_at_ctx,pBVar3);
    }
    if ((BasicBlock *)local_48._M_unused._0_8_ != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_48,
                 (BasicBlock *)local_48._M_unused._0_8_);
    }
    lVar10 = *plVar14;
    for (pIVar11 = *(Instruction **)(lVar10 + 0x20);
        bVar16 = pIVar11 != (Instruction *)(lVar10 + 0x18), bVar16;
        pIVar11 = (pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
      NVar8 = Instruction::GetShader100DebugOpcode(pIVar11);
      if (NVar8 != NonSemanticShaderDebugInfo100DebugFunctionDefinition) {
        pBVar3 = (BasicBlock *)inlined_at_ctx->call_inst_line_;
        this_01 = (IRContext *)
                  new_blocks[1].
                  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if ((this_01->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
          IRContext::BuildDebugInfoManager(this_01);
        }
        uVar7 = analysis::DebugInfoManager::BuildDebugInlinedAtChain
                          ((this_01->debug_info_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                           .
                           super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>
                           ._M_head_impl,(pIVar11->dbg_scope_).inlined_at_,
                           (DebugInlinedAtContext *)local_38);
        bVar6 = InlineSingleInstruction
                          ((InlinePass *)new_blocks,
                           (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)new_blk_ptr,pBVar3,pIVar11,uVar7);
        if (!bVar6) {
          (this->super_Pass)._vptr_Pass = (_func_int **)0x0;
          goto LAB_00223b3e;
        }
      }
    }
    plVar14 = plVar14 + 1;
LAB_00223b3e:
    if (bVar16) {
      return (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
              )(__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
                )this;
    }
  }
  pIVar11 = inlined_at_ctx->call_inst_line_;
  pIVar15 = (InlinePass *)inlined_at_ctx;
LAB_00223b61:
  (this->super_Pass)._vptr_Pass = (_func_int **)pIVar11;
  (pIVar15->super_Pass)._vptr_Pass = (_func_int **)0x0;
  return (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>)
         this;
}

Assistant:

std::unique_ptr<BasicBlock> InlinePass::InlineBasicBlocks(
    std::vector<std::unique_ptr<BasicBlock>>* new_blocks,
    const std::unordered_map<uint32_t, uint32_t>& callee2caller,
    std::unique_ptr<BasicBlock> new_blk_ptr,
    analysis::DebugInlinedAtContext* inlined_at_ctx, Function* calleeFn) {
  auto callee_block_itr = calleeFn->begin();
  ++callee_block_itr;

  while (callee_block_itr != calleeFn->end()) {
    new_blocks->push_back(std::move(new_blk_ptr));
    const auto mapItr =
        callee2caller.find(callee_block_itr->GetLabelInst()->result_id());
    if (mapItr == callee2caller.end()) return nullptr;
    new_blk_ptr = MakeUnique<BasicBlock>(NewLabel(mapItr->second));

    auto tail_inst_itr = callee_block_itr->end();
    for (auto inst_itr = callee_block_itr->begin(); inst_itr != tail_inst_itr;
         ++inst_itr) {
      // Don't inline function definition links, the calling function is not a
      // definition
      if (inst_itr->GetShader100DebugOpcode() ==
          NonSemanticShaderDebugInfo100DebugFunctionDefinition)
        continue;
      if (!InlineSingleInstruction(
              callee2caller, new_blk_ptr.get(), &*inst_itr,
              context()->get_debug_info_mgr()->BuildDebugInlinedAtChain(
                  inst_itr->GetDebugScope().GetInlinedAt(), inlined_at_ctx))) {
        return nullptr;
      }
    }

    ++callee_block_itr;
  }
  return new_blk_ptr;
}